

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O0

void __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::SetUp
          (BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *this)

{
  reference pvVar1;
  double dVar2;
  size_type in_stack_00000008;
  BaseFixture *in_stack_fffffffffffffff0;
  
  BaseFixture::SetUp(in_stack_fffffffffffffff0);
  pica::ParticleTypes::numTypes = 1;
  std::vector<pica::ParticleType,_std::allocator<pica::ParticleType>_>::resize
            ((vector<pica::ParticleType,_std::allocator<pica::ParticleType>_> *)this,
             in_stack_00000008);
  pica::ParticleTypes::types =
       std::vector<pica::ParticleType,_std::allocator<pica::ParticleType>_>::operator[]
                 ((vector<pica::ParticleType,_std::allocator<pica::ParticleType>_> *)
                  pica::ParticleTypes::typesVector,0);
  dVar2 = pica::Constants<double>::electronMass();
  pvVar1 = std::vector<pica::ParticleType,_std::allocator<pica::ParticleType>_>::operator[]
                     ((vector<pica::ParticleType,_std::allocator<pica::ParticleType>_> *)
                      pica::ParticleTypes::typesVector,0);
  pvVar1->mass = dVar2;
  dVar2 = pica::Constants<double>::electronCharge();
  pvVar1 = std::vector<pica::ParticleType,_std::allocator<pica::ParticleType>_>::operator[]
                     ((vector<pica::ParticleType,_std::allocator<pica::ParticleType>_> *)
                      pica::ParticleTypes::typesVector,0);
  pvVar1->charge = dVar2;
  return;
}

Assistant:

virtual void SetUp()
    {
        BaseFixture::SetUp();

        pica::ParticleTypes::numTypes = 1;
        pica::ParticleTypes::typesVector.resize(1);
        pica::ParticleTypes::types = &pica::ParticleTypes::typesVector[0];
        pica::ParticleTypes::typesVector[0].mass = pica::Constants<pica::MassType>::electronMass();
        pica::ParticleTypes::typesVector[0].charge = pica::Constants<pica::ChargeType>::electronCharge();
    }